

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

Read<int> __thiscall Omega_h::subtract_from_each<int>(Omega_h *this,Read<int> *a,int b)

{
  Alloc *pAVar1;
  void *extraout_RDX;
  ulong uVar2;
  size_t sVar3;
  Read<int> RVar4;
  Write<int> c;
  type_conflict f;
  allocator local_69;
  Write<int> local_68;
  type_conflict local_58;
  Write<int> local_30;
  
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar3 = pAVar1->size;
  }
  else {
    sVar3 = (ulong)pAVar1 >> 3;
  }
  std::__cxx11::string::string((string *)&local_58,"",&local_69);
  Write<int>::Write(&local_68,(LO)(sVar3 >> 2),(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  Write<int>::Write(&local_58.c,&local_68);
  Write<int>::Write(&local_58.a.write_,&a->write_);
  if (((ulong)local_68.shared_alloc_.alloc & 1) == 0) {
    uVar2 = (local_68.shared_alloc_.alloc)->size;
  }
  else {
    uVar2 = (ulong)local_68.shared_alloc_.alloc >> 3;
  }
  local_58.b = b;
  parallel_for<Omega_h::subtract_from_each<int>(Omega_h::Read<int>,int)::_lambda(int)_1_>
            ((LO)(uVar2 >> 2),&local_58,"subtract_from_each");
  Write<int>::Write(&local_30,&local_68);
  Read<int>::Read((Read<signed_char> *)this,&local_30);
  Write<int>::~Write(&local_30);
  subtract_from_each<int>(Omega_h::Read<int>,int)::{lambda(int)#1}::~Read
            ((_lambda_int__1_ *)&local_58);
  Write<int>::~Write(&local_68);
  RVar4.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<int>)RVar4.write_.shared_alloc_;
}

Assistant:

Read<T> subtract_from_each(Read<T> a, T b) {
  Write<T> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = a[i] - b; };
  parallel_for(c.size(), f, "subtract_from_each");
  return c;
}